

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Search.cpp
# Opt level: O2

int QuickSelect(int *arr,int left,int right,int k)

{
  int iVar1;
  
  while (iVar1 = left, left < right) {
    iVar1 = partition(arr,left,right,(right + left) / 2);
    if (k < iVar1) {
      right = iVar1 + -1;
    }
    else {
      if (k <= iVar1) break;
      left = iVar1 + 1;
    }
  }
  return arr[iVar1];
}

Assistant:

int QuickSelect(int arr[], int left, int right, int k)
{
	int r, p;
	if (right<=left) {
		return arr[left];
	}
	else {
		p = (right + left) / 2;
		r = partition(arr, left, right, p);
		if (k < r) {
			return QuickSelect(arr, left, r - 1, k);
		}
		if (k > r) {
			return QuickSelect(arr, r + 1, right, k);
		}
		return arr[r];
	}
}